

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio_internal.h
# Opt level: O2

void WriteWaveFormatExtensible
               (FAudioWaveFormatExtensible *fmt,int channels,int samplerate,FAudioGUID *subformat)

{
  uint32_t uVar1;
  
  (fmt->Format).wBitsPerSample = 0x20;
  (fmt->Format).cbSize = 0x16;
  (fmt->Format).wFormatTag = 0xfffe;
  (fmt->Format).nChannels = (uint16_t)channels;
  (fmt->Format).nSamplesPerSec = samplerate;
  (fmt->Format).nBlockAlign = (uint16_t)(channels * 4);
  (fmt->Format).nAvgBytesPerSec = (channels * 4 & 0xffffU) * samplerate;
  (fmt->Samples).wValidBitsPerSample = 0x20;
  uVar1 = 0;
  if ((ushort)(channels - 1U) < 8) {
    uVar1 = *(uint32_t *)(&DAT_001217c4 + (ulong)(channels - 1U & 0xffff) * 4);
  }
  fmt->dwChannelMask = uVar1;
  SDL_memcpy(&fmt->SubFormat,subformat,0x10);
  return;
}

Assistant:

static inline void WriteWaveFormatExtensible(
	FAudioWaveFormatExtensible *fmt,
	int channels,
	int samplerate,
	const FAudioGUID *subformat
) {
	FAudio_assert(fmt != NULL);
	fmt->Format.wBitsPerSample = 32;
	fmt->Format.wFormatTag = FAUDIO_FORMAT_EXTENSIBLE;
	fmt->Format.nChannels = channels;
	fmt->Format.nSamplesPerSec = samplerate;
	fmt->Format.nBlockAlign = (
		fmt->Format.nChannels *
		(fmt->Format.wBitsPerSample / 8)
	);
	fmt->Format.nAvgBytesPerSec = (
		fmt->Format.nSamplesPerSec *
		fmt->Format.nBlockAlign
	);
	fmt->Format.cbSize = sizeof(FAudioWaveFormatExtensible) - sizeof(FAudioWaveFormatEx);
	fmt->Samples.wValidBitsPerSample = 32;
	fmt->dwChannelMask = GetMask(fmt->Format.nChannels);
	FAudio_memcpy(&fmt->SubFormat, subformat, sizeof(FAudioGUID));
}